

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor-xor-rle-per-draw-list-with-vtx-offset.cpp
# Opt level: O3

bool __thiscall
ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::setDrawData
          (XorRlePerDrawListWithVtxOffset *this,ImDrawData *drawData)

{
  DrawLists *__x;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> bVar1;
  ImDrawList *pIVar2;
  ImDrawVert *pIVar3;
  unsigned_short *__first;
  ImDrawCmd *pIVar4;
  pointer pcVar5;
  ImDrawData *pIVar6;
  ImDrawData *pIVar7;
  long lVar8;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> bVar9;
  XorRlePerDrawListWithVtxOffset *pXVar10;
  uint uVar11;
  long lVar12;
  pointer pvVar13;
  uint uVar14;
  ulong __n;
  uint uVar15;
  ulong uVar16;
  DrawListsDiff *this_00;
  uint32_t nCmd;
  uint32_t c;
  float offsetX;
  uint32_t nVertices;
  float offsetY;
  uint32_t offsetVtx;
  uint32_t textureId;
  uint32_t nElements;
  undefined4 local_94;
  uint local_90;
  float local_8c;
  uint local_88;
  float local_84;
  ImDrawData *local_80;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> local_78;
  ImDrawData *local_70;
  uint local_68;
  uint local_64;
  undefined4 local_60;
  uint local_5c;
  ImDrawData *local_58;
  XorRlePerDrawListWithVtxOffset *local_50;
  DrawLists *local_48;
  DrawListsDiff *local_40;
  DrawLists *local_38;
  
  __x = &(this->super_Interface).m_drawListsCur;
  local_38 = &(this->super_Interface).m_drawListsPrev;
  local_50 = this;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::operator=(local_38,__x);
  pIVar7 = (ImDrawData *)(ulong)(uint)drawData->CmdListsCount;
  local_70 = drawData;
  local_48 = __x;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::resize(__x,(size_type)pIVar7);
  local_58 = pIVar7;
  if (pIVar7 != (ImDrawData *)0x0) {
    pIVar7 = (ImDrawData *)0x0;
    do {
      bVar1.container =
           (local_48->
           super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + (long)pIVar7;
      pcVar5 = ((bVar1.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (((bVar1.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
          super__Vector_impl_data._M_finish != pcVar5) {
        ((bVar1.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_finish = pcVar5;
      }
      pIVar2 = local_70->CmdLists[(long)pIVar7];
      pIVar3 = (pIVar2->VtxBuffer).Data;
      local_8c = (pIVar3->pos).x;
      local_84 = (pIVar3->pos).y;
      local_80 = pIVar7;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&local_8c,(char *)&local_88,bVar1);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&local_84,(char *)&local_80,bVar1);
      local_88 = (pIVar2->VtxBuffer).Size;
      if ((ulong)local_88 != 0) {
        pIVar3 = (pIVar2->VtxBuffer).Data;
        lVar8 = 0;
        do {
          *(float *)((long)&(pIVar3->pos).x + lVar8) =
               *(float *)((long)&(pIVar3->pos).x + lVar8) - local_8c;
          *(float *)((long)&(pIVar3->pos).y + lVar8) =
               *(float *)((long)&(pIVar3->pos).y + lVar8) - local_84;
          lVar8 = lVar8 + 0x14;
        } while ((ulong)local_88 * 0x14 != lVar8);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&local_88,(char *)&local_84,bVar1);
      pIVar3 = (pIVar2->VtxBuffer).Data;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)pIVar3,(char *)(pIVar3 + local_88),bVar1);
      if ((ulong)local_88 != 0) {
        pIVar3 = (pIVar2->VtxBuffer).Data;
        lVar8 = 0;
        do {
          *(float *)((long)&(pIVar3->pos).x + lVar8) =
               local_8c + *(float *)((long)&(pIVar3->pos).x + lVar8);
          *(float *)((long)&(pIVar3->pos).y + lVar8) =
               local_84 + *(float *)((long)&(pIVar3->pos).y + lVar8);
          lVar8 = lVar8 + 0x14;
        } while ((ulong)local_88 * 0x14 != lVar8);
      }
      uVar15 = (pIVar2->IdxBuffer).Size;
      local_90 = (uVar15 & 1) + uVar15;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&local_90,(char *)&local_8c,bVar1);
      __first = (pIVar2->IdxBuffer).Data;
      local_78.container = (vector<char,_std::allocator<char>_> *)pIVar2;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)__first,(char *)(__first + uVar15),bVar1);
      if ((uVar15 & 1) != 0) {
        local_94 = local_94 & 0xffff0000;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                  ((char *)&local_94,(char *)((long)&local_94 + 2),bVar1);
      }
      bVar9.container = (vector<char,_std::allocator<char>_> *)local_78;
      local_94 = ((ImVector<ImDrawCmd> *)
                 &(local_78.container)->super__Vector_base<char,_std::allocator<char>_>)->Size;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&local_94,(char *)&local_90,bVar1);
      if (local_94 != 0) {
        uVar15 = 0;
        do {
          pIVar4 = (((ImDrawList *)bVar9.container)->CmdBuffer).Data;
          local_5c = pIVar4[(int)uVar15].ElemCount;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)&local_5c,(char *)&local_58,bVar1);
          local_60 = *(undefined4 *)&pIVar4[(int)uVar15].TextureId;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)&local_60,(char *)&local_5c,bVar1);
          local_64 = pIVar4[(int)uVar15].VtxOffset;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)&local_64,(char *)&local_60,bVar1);
          local_68 = pIVar4[(int)uVar15].IdxOffset;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)&local_68,(char *)&local_64,bVar1);
          bVar9.container = (vector<char,_std::allocator<char>_> *)local_78;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)(pIVar4 + (int)uVar15),(char *)&pIVar4[(int)uVar15].TextureId,bVar1);
          uVar15 = uVar15 + 1;
        } while (uVar15 < local_94);
      }
      pIVar7 = (ImDrawData *)&local_80->field_0x1;
    } while (pIVar7 != local_58);
  }
  pXVar10 = local_50;
  this_00 = &(local_50->super_Interface).m_drawListsDiff;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_00,(local_50->super_Interface).m_drawListsDiff.
                            super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  pIVar7 = local_58;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::resize(this_00,(size_type)local_58);
  if (pIVar7 != (ImDrawData *)0x0) {
    pIVar7 = (ImDrawData *)0x0;
    local_40 = this_00;
    do {
      local_80 = (ImDrawData *)
                 ((local_48->
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + (long)pIVar7);
      pvVar13 = (this_00->
                super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_78.container = pvVar13 + (long)pIVar7;
      pcVar5 = pvVar13[(long)pIVar7].super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar13[(long)pIVar7].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data + 8) != pcVar5) {
        ((local_78.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_finish = pcVar5;
      }
      local_8c = 1.4013e-45;
      pvVar13 = (pXVar10->super_Interface).m_drawListsPrev.
                super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pIVar6 = (ImDrawData *)
               (((long)(pXVar10->super_Interface).m_drawListsPrev.
                       super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
               -0x5555555555555555);
      if ((pIVar6 < pIVar7 || (long)pIVar6 - (long)pIVar7 == 0) ||
         ((long)*(pointer *)
                 ((long)&pvVar13[(long)pIVar7].super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data + 8) -
          *(long *)&pvVar13[(long)pIVar7].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data !=
          (long)*(pointer *)&local_80->TotalIdxCount - *(long *)local_80)) {
        local_8c = 0.0;
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&local_8c,(char *)&local_88,local_78);
      if (local_8c == 1.4013e-45) {
        pvVar13 = (local_38->
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + (long)pIVar7;
        pIVar6 = (ImDrawData *)0x0;
        local_84 = 0.0;
        local_88 = 0;
        local_90 = 0;
        local_94 = 0;
        lVar8 = *(long *)local_80;
        pcVar5 = *(pointer *)&local_80->TotalIdxCount;
        uVar16 = (long)pcVar5 - lVar8;
        local_70 = pIVar7;
        if ((int)uVar16 < 1) {
          uVar15 = 1;
        }
        else {
          pIVar6 = (ImDrawData *)0x0;
          lVar12 = 0;
          uVar15 = 0;
          do {
            bVar1.container = local_78.container;
            uVar14 = *(uint *)(lVar8 + lVar12) ^
                     *(uint *)(*(long *)&(pvVar13->super__Vector_base<char,_std::allocator<char>_>).
                                         _M_impl.super__Vector_impl_data + lVar12);
            if (uVar14 == uVar15) {
              local_94 = local_94 + 1;
            }
            else {
              if (local_94 != 0) {
                std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                          ((char *)&local_94,(char *)&local_90,local_78);
                std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                          ((char *)&local_90,(char *)&local_8c,bVar1);
                lVar8._0_1_ = local_80->Valid;
                lVar8._1_3_ = *(undefined3 *)&local_80->field_0x1;
                lVar8._4_4_ = local_80->CmdListsCount;
                pcVar5 = *(pointer *)&local_80->TotalIdxCount;
              }
              local_94 = 1;
              pIVar6 = (ImDrawData *)(ulong)uVar14;
              local_90 = uVar14;
            }
            lVar12 = lVar12 + 4;
            uVar16 = (long)pcVar5 - lVar8;
            uVar15 = uVar14;
          } while ((int)lVar12 < (int)uVar16);
          uVar15 = local_94 + 1;
        }
        __n = uVar16 & 3;
        uVar14 = local_94;
        if (__n != 0) {
          local_84 = 0.0;
          local_88 = 0;
          uVar16 = (ulong)((uint)uVar16 & 0xfffffffc);
          local_80 = pIVar6;
          memcpy(&local_84,
                 (void *)(*(long *)&(pvVar13->super__Vector_base<char,_std::allocator<char>_>).
                                    _M_impl.super__Vector_impl_data + uVar16),__n);
          memcpy(&local_88,(void *)(lVar8 + uVar16),__n);
          bVar1.container = local_78.container;
          uVar11 = local_88 ^ (uint)local_84;
          uVar14 = uVar15;
          if (uVar11 != (uint)local_80) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                      ((char *)&local_94,(char *)&local_90,local_78);
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                      ((char *)&local_90,(char *)&local_8c,bVar1);
            local_94 = 1;
            uVar14 = local_94;
            local_90 = uVar11;
          }
        }
        local_94 = uVar14;
        pIVar7 = local_70;
        bVar1.container = local_78.container;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                  ((char *)&local_94,(char *)&local_90,local_78);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                  ((char *)&local_90,(char *)&local_8c,bVar1);
        pXVar10 = local_50;
        this_00 = local_40;
      }
      else if (local_8c == 0.0) {
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                  (*(char **)local_80,*(char **)&local_80->TotalIdxCount,local_78);
      }
      pIVar7 = (ImDrawData *)&pIVar7->field_0x1;
    } while (pIVar7 != local_58);
  }
  return true;
}

Assistant:

bool XorRlePerDrawListWithVtxOffset::setDrawData(const ::ImDrawData * drawData) {
    m_drawListsPrev = m_drawListsCur;

    uint32_t nCmdLists = drawData->CmdListsCount;
    m_drawListsCur.resize(nCmdLists);

    for (uint32_t iList = 0; iList < nCmdLists; iList++) {
        m_drawListsCur[iList].clear();
        ::writeCmdListToBuffer(drawData->CmdLists[iList], m_drawListsCur[iList]);
    }

    // calculate diff

    m_drawListsDiff.clear();
    m_drawListsDiff.resize(nCmdLists);

    for (uint32_t iList = 0; iList < nCmdLists; ++iList) {
        auto & bufferCur = m_drawListsCur[iList];
        auto & bufferDiff = m_drawListsDiff[iList];

        bufferDiff.clear();

        int32_t type = 1; // Run-Length Encoding
        if (iList >= m_drawListsPrev.size() || m_drawListsPrev[iList].size() != bufferCur.size()) {
            type = 0; // Full update
        }

        std::copy((char *)(&type), (char *)(&type) + sizeof(type), std::back_inserter(bufferDiff));

        if (type == 0) {
            std::copy(bufferCur.begin(), bufferCur.end(), std::back_inserter(bufferDiff));
        } else if (type == 1) {
            auto & bufferPrev = m_drawListsPrev[iList];

            uint32_t a = 0;
            uint32_t b = 0;
            uint32_t c = 0;
            uint32_t n = 0;

            for (int i = 0; i < (int) bufferCur.size(); i += 4) {
                std::memcpy((char *)(&a), bufferPrev.data() + i, sizeof(uint32_t));
                std::memcpy((char *)(&b), bufferCur.data() + i, sizeof(uint32_t));
                a = a ^ b;
                if (a == c) {
                    ++n;
                } else {
                    if (n > 0) {
                        std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                        std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    }
                    n = 1;
                    c = a;
                }
            }

            if (bufferCur.size() % 4 != 0) {
                a = 0;
                b = 0;
                uint32_t i = (bufferCur.size()/4)*4;
                uint32_t k = bufferCur.size() - i;
                std::memcpy((char *)(&a), bufferPrev.data() + i, k);
                std::memcpy((char *)(&b), bufferCur.data() + i, k);
                a = a ^ b;
                if (a == c) {
                    ++n;
                } else {
                    std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    n = 1;
                    c = a;
                }
            }

            std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
            std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
        }
    }

    return true;
}